

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMAttrMapImpl.cpp
# Opt level: O3

DOMNode * __thiscall xercesc_4_0::DOMAttrMapImpl::setNamedItemNS(DOMAttrMapImpl *this,DOMNode *arg)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  DOMDocument *doc;
  long *plVar5;
  long lVar6;
  DOMNodeImpl *this_00;
  DOMDocument *pDVar7;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  DOMNodeVector *pDVar8;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  DOMException *this_01;
  ulong index;
  DOMNode *pDVar9;
  DOMNode *pDVar10;
  MemoryManager **ppMVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_03;
  
  iVar2 = (*arg->_vptr_DOMNode[4])(arg);
  if (iVar2 == 2) {
    iVar2 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
    doc = (DOMDocument *)CONCAT44(extraout_var,iVar2);
    plVar5 = (long *)__dynamic_cast(arg,&DOMNode::typeinfo,&HasDOMNodeImpl::typeinfo,
                                    0xfffffffffffffffe);
    if ((plVar5 == (long *)0x0) || (lVar6 = (**(code **)(*plVar5 + 0x10))(plVar5), lVar6 == 0)) {
      this_01 = (DOMException *)__cxa_allocate_exception(0x28);
      DOMException::DOMException(this_01,0xb,0,XMLPlatformUtils::fgMemoryManager);
    }
    else {
      this_00 = (DOMNodeImpl *)(**(code **)(*plVar5 + 0x10))(plVar5);
      pDVar7 = DOMNodeImpl::getOwnerDocument(this_00);
      if (pDVar7 == doc) {
        bVar1 = readOnly(this);
        if (bVar1) {
          this_01 = (DOMException *)__cxa_allocate_exception(0x28);
          ppMVar11 = &XMLPlatformUtils::fgMemoryManager;
          if ((this->fOwnerNode != (DOMNode *)0x0) &&
             (iVar2 = (*this->fOwnerNode->_vptr_DOMNode[0xc])(),
             CONCAT44(extraout_var_08,iVar2) != 0)) {
            iVar2 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
            ppMVar11 = (MemoryManager **)(CONCAT44(extraout_var_09,iVar2) + 0x158);
          }
          DOMException::DOMException(this_01,7,0,*ppMVar11);
        }
        else {
          if ((*(uint *)&this_00->flags & 8) == 0) {
            this_00->fOwnerNode = this->fOwnerNode;
            this_00->flags = (ushort)*(uint *)&this_00->flags | 8;
            iVar2 = (*arg->_vptr_DOMNode[0x16])(arg);
            iVar3 = (*arg->_vptr_DOMNode[0x18])(arg);
            uVar4 = (*(this->super_DOMNamedNodeMap)._vptr_DOMNamedNodeMap[0xf])
                              (this,CONCAT44(extraout_var_00,iVar2),CONCAT44(extraout_var_01,iVar3))
            ;
            if ((int)uVar4 < 0) {
              iVar2 = (*arg->_vptr_DOMNode[2])(arg);
              uVar4 = (*(this->super_DOMNamedNodeMap)._vptr_DOMNamedNodeMap[0xe])
                                (this,CONCAT44(extraout_var_02,iVar2));
              pDVar8 = this->fNodes;
              if (pDVar8 == (DOMNodeVector *)0x0) {
                pDVar9 = &doc[-1].super_DOMNode;
                if (doc == (DOMDocument *)0x0) {
                  pDVar9 = (DOMNode *)0x0;
                }
                iVar2 = (*pDVar9->_vptr_DOMNode[4])(pDVar9,0x18);
                pDVar8 = (DOMNodeVector *)CONCAT44(extraout_var_03,iVar2);
                DOMNodeVector::DOMNodeVector(pDVar8,doc);
                this->fNodes = pDVar8;
              }
              DOMNodeVector::insertElementAt(pDVar8,arg,(ulong)((int)uVar4 >> 0x1f ^ uVar4));
            }
            else {
              pDVar8 = this->fNodes;
              index = (ulong)uVar4;
              if (index < pDVar8->nextFreeSlot) {
                pDVar9 = pDVar8->data[index];
                DOMNodeVector::setElementAt(pDVar8,arg,index);
                if (pDVar9 != (DOMNode *)0x0) {
                  pDVar10 = &doc->super_DOMNode;
                  if (doc == (DOMDocument *)0x0) {
                    pDVar10 = (DOMNode *)0x0;
                  }
                  plVar5 = (long *)__dynamic_cast(pDVar9,&DOMNode::typeinfo,
                                                  &HasDOMNodeImpl::typeinfo,0xfffffffffffffffe);
                  if ((plVar5 == (long *)0x0) ||
                     (lVar6 = (**(code **)(*plVar5 + 0x10))(plVar5), lVar6 == 0)) {
                    this_01 = (DOMException *)__cxa_allocate_exception(0x28);
                    DOMException::DOMException(this_01,0xb,0,XMLPlatformUtils::fgMemoryManager);
                  }
                  else {
                    lVar6 = (**(code **)(*plVar5 + 0x10))(plVar5);
                    *(DOMNode **)(lVar6 + 8) = pDVar10;
                    plVar5 = (long *)__dynamic_cast(pDVar9,&DOMNode::typeinfo,
                                                    &HasDOMNodeImpl::typeinfo,0xfffffffffffffffe);
                    if ((plVar5 != (long *)0x0) &&
                       (lVar6 = (**(code **)(*plVar5 + 0x10))(plVar5), lVar6 != 0)) {
                      lVar6 = (**(code **)(*plVar5 + 0x10))(plVar5);
                      *(ushort *)(lVar6 + 0x10) = *(ushort *)(lVar6 + 0x10) & 0xfff7;
                      return pDVar9;
                    }
                    this_01 = (DOMException *)__cxa_allocate_exception(0x28);
                    DOMException::DOMException(this_01,0xb,0,XMLPlatformUtils::fgMemoryManager);
                  }
                  goto LAB_0025b81c;
                }
              }
              else {
                DOMNodeVector::setElementAt(pDVar8,arg,index);
              }
            }
            return (DOMNode *)0x0;
          }
          this_01 = (DOMException *)__cxa_allocate_exception(0x28);
          ppMVar11 = &XMLPlatformUtils::fgMemoryManager;
          if ((this->fOwnerNode != (DOMNode *)0x0) &&
             (iVar2 = (*this->fOwnerNode->_vptr_DOMNode[0xc])(),
             CONCAT44(extraout_var_10,iVar2) != 0)) {
            iVar2 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
            ppMVar11 = (MemoryManager **)(CONCAT44(extraout_var_11,iVar2) + 0x158);
          }
          DOMException::DOMException(this_01,10,0,*ppMVar11);
        }
      }
      else {
        this_01 = (DOMException *)__cxa_allocate_exception(0x28);
        ppMVar11 = &XMLPlatformUtils::fgMemoryManager;
        if ((this->fOwnerNode != (DOMNode *)0x0) &&
           (iVar2 = (*this->fOwnerNode->_vptr_DOMNode[0xc])(), CONCAT44(extraout_var_06,iVar2) != 0)
           ) {
          iVar2 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
          ppMVar11 = (MemoryManager **)(CONCAT44(extraout_var_07,iVar2) + 0x158);
        }
        DOMException::DOMException(this_01,4,0,*ppMVar11);
      }
    }
  }
  else {
    this_01 = (DOMException *)__cxa_allocate_exception(0x28);
    ppMVar11 = &XMLPlatformUtils::fgMemoryManager;
    if ((this->fOwnerNode != (DOMNode *)0x0) &&
       (iVar2 = (*this->fOwnerNode->_vptr_DOMNode[0xc])(), CONCAT44(extraout_var_04,iVar2) != 0)) {
      iVar2 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
      ppMVar11 = (MemoryManager **)(CONCAT44(extraout_var_05,iVar2) + 0x158);
    }
    DOMException::DOMException(this_01,3,0,*ppMVar11);
  }
LAB_0025b81c:
  __cxa_throw(this_01,&DOMException::typeinfo,DOMException::~DOMException);
}

Assistant:

DOMNode *DOMAttrMapImpl::setNamedItemNS(DOMNode* arg)
{
    if (arg->getNodeType() != DOMNode::ATTRIBUTE_NODE)
        throw DOMException(DOMException::HIERARCHY_REQUEST_ERR, 0, GetDOMNamedNodeMapMemoryManager);

    DOMDocument *doc = fOwnerNode->getOwnerDocument();
    DOMNodeImpl *argImpl = castToNodeImpl(arg);
    if (argImpl->getOwnerDocument() != doc)
        throw DOMException(DOMException::WRONG_DOCUMENT_ERR,0, GetDOMNamedNodeMapMemoryManager);
    if (this->readOnly())
        throw DOMException(DOMException::NO_MODIFICATION_ALLOWED_ERR, 0, GetDOMNamedNodeMapMemoryManager);
    if (argImpl->isOwned())
        throw DOMException(DOMException::INUSE_ATTRIBUTE_ERR,0, GetDOMNamedNodeMapMemoryManager);

    argImpl->fOwnerNode = fOwnerNode;
    argImpl->isOwned(true);
    int i=findNamePoint(arg->getNamespaceURI(), arg->getLocalName());
    DOMNode *previous=0;
    if(i>=0) {
        previous = fNodes->elementAt(i);
        fNodes->setElementAt(arg,i);
    } else {
        i=findNamePoint(arg->getNodeName()); // Insert point (may be end of list)
        if (i<0)
          i = -1 - i;
        if(0==fNodes)
            fNodes=new ((DOMDocumentImpl*)doc) DOMNodeVector(doc);
        fNodes->insertElementAt(arg,i);
    }
    if (previous != 0) {
        castToNodeImpl(previous)->fOwnerNode = doc;
        castToNodeImpl(previous)->isOwned(false);
    }

    return previous;
}